

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_cli.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  bool local_39;
  char *arg;
  int i;
  int usage;
  int retval;
  char *fname;
  char **argv_local;
  int argc_local;
  
  _usage = (char *)0x0;
  bVar1 = false;
  for (arg._4_4_ = 1; arg._4_4_ < argc; arg._4_4_ = arg._4_4_ + 1) {
    __s1 = argv[arg._4_4_];
    iVar2 = strcmp(__s1,"--dump-calls");
    if (iVar2 == 0) {
      dump_calls = 1;
      __s1 = _usage;
    }
    else {
      iVar2 = strcmp(__s1,"--no-dump-calls");
      if (iVar2 == 0) {
        dump_calls = 0;
        __s1 = _usage;
      }
      else {
        iVar2 = strcmp(__s1,"--dump-callers");
        if (iVar2 == 0) {
          dump_callers = 1;
          __s1 = _usage;
        }
        else {
          iVar2 = strcmp(__s1,"--no-dump-callers");
          if (iVar2 == 0) {
            dump_callers = 0;
            __s1 = _usage;
          }
          else {
            iVar2 = strcmp(__s1,"--dump-errors");
            if (iVar2 == 0) {
              dump_errors = 1;
              __s1 = _usage;
            }
            else {
              iVar2 = strcmp(__s1,"--no-dump-errors");
              if (iVar2 == 0) {
                dump_errors = 0;
                __s1 = _usage;
              }
              else {
                iVar2 = strcmp(__s1,"--dump-state-changes");
                if (iVar2 == 0) {
                  dump_state_changes = 1;
                  __s1 = _usage;
                }
                else {
                  iVar2 = strcmp(__s1,"--no-dump-state-changes");
                  if (iVar2 == 0) {
                    dump_state_changes = 0;
                    __s1 = _usage;
                  }
                  else {
                    iVar2 = strcmp(__s1,"--dump-all");
                    if (iVar2 == 0) {
                      dump_state_changes = 1;
                      dump_errors = 1;
                      dump_callers = 1;
                      dump_calls = 1;
                      __s1 = _usage;
                    }
                    else {
                      iVar2 = strcmp(__s1,"--no-dump-all");
                      if (iVar2 == 0) {
                        dump_state_changes = 0;
                        dump_errors = 0;
                        dump_callers = 0;
                        dump_calls = 0;
                        __s1 = _usage;
                      }
                      else {
                        iVar2 = strcmp(__s1,"--run");
                        if (iVar2 == 0) {
                          run_calls = 1;
                          __s1 = _usage;
                        }
                        else {
                          iVar2 = strcmp(__s1,"--no-run");
                          if (iVar2 == 0) {
                            run_calls = 0;
                            __s1 = _usage;
                          }
                          else {
                            iVar2 = strcmp(__s1,"--help");
                            if (iVar2 == 0) {
                              bVar1 = true;
                              __s1 = _usage;
                            }
                            else if (_usage != (char *)0x0) {
                              bVar1 = true;
                              __s1 = _usage;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    _usage = __s1;
  }
  if (_usage == (char *)0x0) {
    bVar1 = true;
  }
  if (bVar1) {
    fprintf(_stderr,"USAGE: %s [args] <altrace.trace>\n",*argv);
    fprintf(_stderr,"  args:\n");
    fprintf(_stderr,"   --[no-]dump-calls\n");
    fprintf(_stderr,"   --[no-]dump-callers\n");
    fprintf(_stderr,"   --[no-]dump-errors\n");
    fprintf(_stderr,"   --[no-]dump-state-changes\n");
    fprintf(_stderr,"   --[no-]dump-all\n");
    fprintf(_stderr,"   --[no-]run\n");
    fprintf(_stderr,"\n");
    return 1;
  }
  local_39 = true;
  if (((dump_calls == 0) && (local_39 = true, dump_callers == 0)) &&
     (local_39 = true, dump_errors == 0)) {
    local_39 = dump_state_changes != 0;
  }
  dumping = (int)local_39;
  if (run_calls != 0) {
    iVar2 = init_clock();
    if (iVar2 == 0) {
      return 1;
    }
    iVar2 = load_real_openal();
    if (iVar2 == 0) {
      return 1;
    }
  }
  fprintf(_stderr,"\n\n\n%s: Playback OpenAL session from log file \'%s\'\n\n\n",GAppName,_usage);
  iVar2 = process_tracelog(_usage,(void *)0x0);
  i = (int)(iVar2 == 0);
  if (run_calls != 0) {
    close_real_openal();
  }
  return i;
}

Assistant:

int main(int argc, char **argv)
{
    const char *fname = NULL;
    int retval = 0;
    int usage = 0;
    int i;

    for (i = 1; i < argc; i++) {
        const char *arg = argv[i];
        if (strcmp(arg, "--dump-calls") == 0) {
            dump_calls = 1;
        } else if (strcmp(arg, "--no-dump-calls") == 0) {
            dump_calls = 0;
        } else if (strcmp(arg, "--dump-callers") == 0) {
            dump_callers = 1;
        } else if (strcmp(arg, "--no-dump-callers") == 0) {
            dump_callers = 0;
        } else if (strcmp(arg, "--dump-errors") == 0) {
            dump_errors = 1;
        } else if (strcmp(arg, "--no-dump-errors") == 0) {
            dump_errors = 0;
        } else if (strcmp(arg, "--dump-state-changes") == 0) {
            dump_state_changes = 1;
        } else if (strcmp(arg, "--no-dump-state-changes") == 0) {
            dump_state_changes = 0;
        } else if (strcmp(arg, "--dump-all") == 0) {
            dump_calls = dump_callers = dump_errors = dump_state_changes = 1;
        } else if (strcmp(arg, "--no-dump-all") == 0) {
            dump_calls = dump_callers = dump_errors = dump_state_changes = 0;
        } else if (strcmp(arg, "--run") == 0) {
            run_calls = 1;
        } else if (strcmp(arg, "--no-run") == 0) {
            run_calls = 0;
        } else if (strcmp(arg, "--help") == 0) {
            usage = 1;
        } else if (fname == NULL) {
            fname = arg;
        } else {
            usage = 1;
        }
    }

    if (fname == NULL) {
        usage = 1;
    }

    if (usage) {
        fprintf(stderr, "USAGE: %s [args] <altrace.trace>\n", argv[0]);
        fprintf(stderr, "  args:\n");
        fprintf(stderr, "   --[no-]dump-calls\n");
        fprintf(stderr, "   --[no-]dump-callers\n");
        fprintf(stderr, "   --[no-]dump-errors\n");
        fprintf(stderr, "   --[no-]dump-state-changes\n");
        fprintf(stderr, "   --[no-]dump-all\n");
        fprintf(stderr, "   --[no-]run\n");
        fprintf(stderr, "\n");
        return 1;
    }

    dumping = dump_calls || dump_callers || dump_errors || dump_state_changes;

    if (run_calls) {
        if (!init_clock()) {
            return 1;
        }

        if (!load_real_openal()) {
            return 1;
        }
    }

    fprintf(stderr, "\n\n\n%s: Playback OpenAL session from log file '%s'\n\n\n", GAppName, fname);

    if (!process_tracelog(fname, NULL)) {
        retval = 1;
    }

    if (run_calls) {
        close_real_openal();
    }

    return retval;
}